

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode
JsDiagGetBreakOnException
          (JsRuntimeHandle runtimeHandle,JsDiagBreakOnExceptionAttributes *exceptionAttributes)

{
  anon_class_16_2_54b2c60f fn;
  JsErrorCode JVar1;
  JsDiagBreakOnExceptionAttributes *local_18;
  JsDiagBreakOnExceptionAttributes *exceptionAttributes_local;
  JsRuntimeHandle runtimeHandle_local;
  
  fn.exceptionAttributes = &local_18;
  fn.runtimeHandle = &exceptionAttributes_local;
  local_18 = exceptionAttributes;
  exceptionAttributes_local = (JsDiagBreakOnExceptionAttributes *)runtimeHandle;
  JVar1 = GlobalAPIWrapper_NoRecord<JsDiagGetBreakOnException::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDiagGetBreakOnException(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_ JsDiagBreakOnExceptionAttributes* exceptionAttributes)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(exceptionAttributes);

        *exceptionAttributes = JsDiagBreakOnExceptionAttributeNone;

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        *exceptionAttributes = jsrtDebugManager->GetBreakOnException();

        return JsNoError;
    });
#endif
}